

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpgd.cpp
# Opt level: O1

void __thiscall jpgd::jpeg_decoder::calc_mcu_block_order(jpeg_decoder *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  int iVar8;
  
  lVar7 = (long)this->m_comps_in_frame;
  if (lVar7 < 1) {
    iVar6 = 0;
    iVar3 = 0;
  }
  else {
    lVar4 = 0;
    iVar3 = 0;
    iVar6 = 0;
    do {
      if (iVar6 < this->m_comp_h_samp[lVar4]) {
        iVar6 = this->m_comp_h_samp[lVar4];
      }
      if (iVar3 < this->m_comp_v_samp[lVar4]) {
        iVar3 = this->m_comp_v_samp[lVar4];
      }
      lVar4 = lVar4 + 1;
    } while (lVar7 != lVar4);
  }
  if (0 < this->m_comps_in_frame) {
    iVar8 = this->m_image_x_size;
    iVar2 = this->m_image_y_size;
    lVar4 = 0;
    do {
      iVar1 = (this->m_comp_h_samp[lVar4] * iVar8 + iVar6 + -1) / iVar6;
      iVar5 = iVar1 + 7;
      iVar1 = iVar1 + 0xe;
      if (-1 < iVar5) {
        iVar1 = iVar5;
      }
      this->m_comp_h_blocks[lVar4] = iVar1 >> 3;
      iVar1 = (this->m_comp_v_samp[lVar4] * iVar2 + iVar3 + -1) / iVar3;
      iVar5 = iVar1 + 7;
      iVar1 = iVar1 + 0xe;
      if (-1 < iVar5) {
        iVar1 = iVar5;
      }
      this->m_comp_v_blocks[lVar4] = iVar1 >> 3;
      lVar4 = lVar4 + 1;
    } while (lVar7 != lVar4);
  }
  if (this->m_comps_in_scan == 1) {
    this->m_mcus_per_row = this->m_comp_h_blocks[this->m_comp_list[0]];
    iVar3 = this->m_comp_v_blocks[this->m_comp_list[0]];
  }
  else {
    iVar8 = this->m_image_x_size + 7;
    iVar2 = this->m_image_x_size + 0xe;
    if (-1 < iVar8) {
      iVar2 = iVar8;
    }
    this->m_mcus_per_row = ((iVar2 >> 3) + iVar6 + -1) / iVar6;
    iVar6 = this->m_image_y_size + 7;
    iVar8 = this->m_image_y_size + 0xe;
    if (-1 < iVar6) {
      iVar8 = iVar6;
    }
    iVar3 = (iVar3 + (iVar8 >> 3) + -1) / iVar3;
  }
  this->m_mcus_per_col = iVar3;
  if (this->m_comps_in_scan == 1) {
    this->m_mcu_org[0] = this->m_comp_list[0];
    this->m_blocks_per_mcu = 1;
    return;
  }
  this->m_blocks_per_mcu = 0;
  if (0 < this->m_comps_in_scan) {
    lVar7 = 0;
    do {
      iVar3 = this->m_comp_list[lVar7];
      for (iVar6 = this->m_comp_v_samp[iVar3] * this->m_comp_h_samp[iVar3]; iVar6 != 0;
          iVar6 = iVar6 + -1) {
        iVar8 = this->m_blocks_per_mcu;
        this->m_blocks_per_mcu = iVar8 + 1;
        this->m_mcu_org[iVar8] = iVar3;
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 < this->m_comps_in_scan);
  }
  return;
}

Assistant:

void jpeg_decoder::calc_mcu_block_order()
{
  int component_num, component_id;
  int max_h_samp = 0, max_v_samp = 0;

  for (component_id = 0; component_id < m_comps_in_frame; component_id++)
  {
    if (m_comp_h_samp[component_id] > max_h_samp)
      max_h_samp = m_comp_h_samp[component_id];

    if (m_comp_v_samp[component_id] > max_v_samp)
      max_v_samp = m_comp_v_samp[component_id];
  }

  for (component_id = 0; component_id < m_comps_in_frame; component_id++)
  {
    m_comp_h_blocks[component_id] = ((((m_image_x_size * m_comp_h_samp[component_id]) + (max_h_samp - 1)) / max_h_samp) + 7) / 8;
    m_comp_v_blocks[component_id] = ((((m_image_y_size * m_comp_v_samp[component_id]) + (max_v_samp - 1)) / max_v_samp) + 7) / 8;
  }

  if (m_comps_in_scan == 1)
  {
    m_mcus_per_row = m_comp_h_blocks[m_comp_list[0]];
    m_mcus_per_col = m_comp_v_blocks[m_comp_list[0]];
  }
  else
  {
    m_mcus_per_row = (((m_image_x_size + 7) / 8) + (max_h_samp - 1)) / max_h_samp;
    m_mcus_per_col = (((m_image_y_size + 7) / 8) + (max_v_samp - 1)) / max_v_samp;
  }

  if (m_comps_in_scan == 1)
  {
    m_mcu_org[0] = m_comp_list[0];

    m_blocks_per_mcu = 1;
  }
  else
  {
    m_blocks_per_mcu = 0;

    for (component_num = 0; component_num < m_comps_in_scan; component_num++)
    {
      int num_blocks;

      component_id = m_comp_list[component_num];

      num_blocks = m_comp_h_samp[component_id] * m_comp_v_samp[component_id];

      while (num_blocks--)
        m_mcu_org[m_blocks_per_mcu++] = component_id;
    }
  }
}